

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfcn.c
# Opt level: O2

ssize_t mpt_memrfcn(iovec *data,size_t ndat,_func_int_int_void_ptr *fcn,void *par)

{
  void *pvVar1;
  int iVar2;
  size_t *psVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t local_50;
  
  if (fcn == (_func_int_int_void_ptr *)0x0 || data == (iovec *)0x0) {
    local_50 = 0xffffffffffffffff;
    iVar2 = 0xe;
LAB_00113b70:
    piVar4 = __errno_location();
    *piVar4 = iVar2;
  }
  else {
    do {
      sVar7 = ndat - 1;
      if (ndat == 0) {
        local_50 = 0xfffffffffffffffe;
        iVar2 = 0xb;
        goto LAB_00113b70;
      }
      pvVar1 = data[sVar7].iov_base;
      sVar6 = data[sVar7].iov_len;
      do {
        sVar5 = sVar6;
        sVar6 = sVar5 - 1;
        if (sVar5 == 0) goto LAB_00113b53;
        iVar2 = (*fcn)((int)*(undefined1 *)((long)pvVar1 + (sVar5 - 1)),par);
        psVar3 = &data->iov_len;
      } while (iVar2 == 0);
      do {
        ndat = ndat - 1;
        local_50 = sVar6;
        if (ndat == 0) goto LAB_00113b53;
        sVar6 = sVar6 + *psVar3;
        psVar3 = psVar3 + 2;
      } while (-1 < (long)sVar6);
      piVar4 = __errno_location();
      *piVar4 = 0x4b;
      local_50 = 0xffffffffffffffff;
LAB_00113b53:
      ndat = sVar7;
    } while (sVar5 == 0);
  }
  return local_50;
}

Assistant:

extern ssize_t mpt_memrfcn(const struct iovec *data, size_t ndat, int (*fcn)(int , void *), void *par)
{
	size_t i = ndat;
	
	if (!data || !fcn) {
		errno = EFAULT; return -1;
	}
	
	while (i--) {
		unsigned char *tmp = data[i].iov_base;
		size_t pos = data[i].iov_len;
		
		while (pos--) {
			if (fcn(tmp[pos], par)) {
				for (ndat = 0; ndat < i; ++ndat) {
					if ((pos += data[ndat].iov_len) > SSIZE_MAX) {
						errno = EOVERFLOW;
						return -1;
					}
				}
				return pos;
			}
		}
	}
	
	errno = EAGAIN;
	
	return -2;
}